

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O3

string * __thiscall
ast::Conditional_expression::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,Conditional_expression *this)

{
  long lVar1;
  
  if (((this->super_Expression).type != LABEL) ||
     (lVar1 = 0x30, (short)this->logical_expression->value == 0)) {
    lVar1 = 0x38;
  }
  (**(code **)(**(long **)((long)&(this->super_Expression)._vptr_Expression + lVar1) + 0x20))
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string get_symbol() {	//	get_type() só pode ser invocado depois de evaluate().
		return get_type() == LABEL && logical_expression->get_value()
					? true_expression->get_symbol()
					: false_expression->get_symbol();
	}